

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O2

void g_ptr_array_insert(GPtrArray *array,gint index_,gpointer data)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)index_;
  g_ptr_array_maybe_expand((GRealPtrArray *)array,1);
  uVar1 = array->len;
  uVar2 = uVar1;
  if ((index_ < 0) || (uVar2 = index_, uVar1 < (uint)index_ || uVar1 - index_ == 0)) {
    uVar3 = (ulong)(int)uVar2;
  }
  else {
    memmove(array->pdata + uVar3 + 1,array->pdata + uVar3,(ulong)(uVar1 - index_) << 3);
    uVar1 = array->len;
  }
  array->len = uVar1 + 1;
  array->pdata[uVar3] = data;
  return;
}

Assistant:

void g_ptr_array_insert (GPtrArray *array, gint index_, gpointer data)
{
    GRealPtrArray *rarray = (GRealPtrArray *)array;

    g_return_if_fail (rarray);
    g_return_if_fail (index_ >= -1);
    g_return_if_fail (index_ <= (gint)rarray->len);

    g_ptr_array_maybe_expand (rarray, 1);

    if (index_ < 0)
        index_ = rarray->len;

    if ((guint) index_ < rarray->len)
        memmove (&(rarray->pdata[index_ + 1]),
                &(rarray->pdata[index_]),
                (rarray->len - index_) * sizeof (gpointer));

    rarray->len++;
    rarray->pdata[index_] = data;
}